

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot.h
# Opt level: O2

Plot * plotBars<Result<unsigned_int,double>>
                 (Plot *__return_storage_ptr__,
                 vector<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
                 *rs,function<double_(const_Result<unsigned_int,_double>_&)> *valueFunc,
                 storage_t sizePercent,string *title,string *yLabel)

{
  pointer pRVar1;
  DrawSpecs *pDVar2;
  long lVar3;
  size_type i;
  ulong uVar4;
  storage_range_t sVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  double local_d0;
  vector<double,_std::allocator<double>_> y;
  string local_90;
  string local_70;
  function<double_(const_Result<unsigned_int,_double>_&)> local_50;
  
  std::function<double_(const_Result<unsigned_int,_double>_&)>::function(&local_50,valueFunc);
  sVar5 = calculateMedianRange<Result<unsigned_int,double>>(rs,&local_50,sizePercent);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  sciplot::Plot::Plot(__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",(allocator<char> *)&x);
  sciplot::Plot::xlabel(__return_storage_ptr__,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  (__return_storage_ptr__->m_legend).super_ShowSpecsOf<sciplot::LegendSpecs>.m_show = false;
  std::__cxx11::string::assign
            ((char *)&(__return_storage_ptr__->m_xtics_major_bottom).
                      super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>.m_rotate);
  sciplot::LineSpecsOf<sciplot::BorderSpecs>::lineWidth
            (&(__return_storage_ptr__->m_border).super_LineSpecsOf<sciplot::BorderSpecs>,1);
  std::__cxx11::string::string((string *)&local_90,(string *)yLabel);
  sciplot::Plot::ylabel(__return_storage_ptr__,&local_90);
  uVar4 = -(ulong)(sVar5.second - sVar5.first == 0.0);
  std::__cxx11::string::~string((string *)&local_90);
  sciplot::Plot::yrange
            (__return_storage_ptr__,0.0,
             (double)(~uVar4 & (ulong)sVar5.second | (ulong)(sVar5.first + 1.0) & uVar4));
  sciplot::Plot::boxWidthRelative(__return_storage_ptr__,0.75);
  x.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  x.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  x.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar3 = 0x40;
  for (uVar4 = 0;
      pRVar1 = (rs->
               super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(rs->
                             super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x120);
      uVar4 = uVar4 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&x,(value_type *)((long)&(pRVar1->suiteName)._M_dataplus._M_p + lVar3));
    local_d0 = std::function<double_(const_Result<unsigned_int,_double>_&)>::operator()
                         (valueFunc,
                          (Result<unsigned_int,_double> *)
                          ((long)(rs->
                                 super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x40));
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&y,&local_d0);
    lVar3 = lVar3 + 0x120;
  }
  pDVar2 = sciplot::Plot::
           drawBoxes<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
                     (__return_storage_ptr__,&x,&y);
  sciplot::FillSpecsOf<sciplot::DrawSpecs>::fillSolid
            (&pDVar2->super_FillSpecsOf<sciplot::DrawSpecs>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&x);
  return __return_storage_ptr__;
}

Assistant:

sciplot::Plot plotBars(const std::vector<ResultT>& rs, std::function<typename ResultT::storage_t(const ResultT&)> valueFunc, typename ResultT::storage_t sizePercent, const std::string& title, const std::string& yLabel)
{
    auto rangePercent = calculateMedianRange(rs, valueFunc, sizePercent);
    rangePercent.second = rangePercent.second - rangePercent.first == 0 ? rangePercent.first + 1 : rangePercent.second;
    const auto& fr = rs.front();
    sciplot::Plot p;
    p.tics();
    p.xlabel("");
    p.legend().hide();
    p.xtics().rotate();
    // p.legend().title(title);
    p.border().lineWidth(1);
    p.ylabel(yLabel);
    p.yrange(0, rangePercent.second);
    p.boxWidthRelative(0.75F);
    std::vector<std::string> x;
    std::vector<typename ResultT::storage_t> y;
    for (decltype(rs.size()) i = 0; i < rs.size(); i++)
    {
        x.push_back(rs[i].description);
        y.push_back(valueFunc(rs[i]));
    }
    p.drawBoxes(x, y).fillSolid();
    return p;
}